

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

void av1_set_frame_refs(AV1_COMMON *cm,int *remapped_ref_idx,int lst_map_idx,int gld_map_idx)

{
  SequenceHeader *pSVar1;
  RefCntBuffer *pRVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  int map_idx;
  undefined4 uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  REF_FRAME_INFO ref_frame_info [8];
  undefined8 local_130;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 local_11c;
  undefined4 uStack_118;
  undefined8 uStack_114;
  ulong local_100;
  int local_f8 [4];
  int local_e8 [2];
  int local_e0 [36];
  int local_50;
  
  pSVar1 = cm->seq_params;
  uVar7 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
  uVar4 = (cm->current_frame).order_hint;
  uStack_118 = 0;
  uStack_114 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_11c = 0;
  local_100 = (ulong)(uint)lst_map_idx;
  iVar3 = -1;
  piVar8 = local_e8;
  uVar11 = 0;
  iVar9 = -1;
  do {
    piVar8[-4] = (int)uVar11;
    *piVar8 = -1;
    pRVar2 = cm->ref_frame_map[uVar11];
    *(RefCntBuffer **)(piVar8 + -2) = pRVar2;
    if (pRVar2 != (RefCntBuffer *)0x0) {
      if (pRVar2->order_hint == 0xffffffff) {
        iVar12 = -1;
      }
      else {
        uVar14 = pRVar2->order_hint - uVar4;
        iVar12 = (uVar7 - 1 & uVar14) - (uVar14 & uVar7);
        if ((pSVar1->order_hint_info).enable_order_hint == 0) {
          iVar12 = 0;
        }
        iVar12 = iVar12 + uVar7;
      }
      if (local_100 == uVar11) {
        iVar3 = iVar12;
      }
      *piVar8 = iVar12;
      if ((uint)gld_map_idx == uVar11) {
        iVar9 = iVar12;
      }
    }
    uVar11 = uVar11 + 1;
    piVar8 = piVar8 + 6;
  } while (uVar11 != 8);
  local_130 = remapped_ref_idx;
  if ((iVar3 == -1) || ((int)uVar7 <= iVar3)) {
    aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  if ((iVar9 == -1) || ((int)uVar7 <= iVar9)) {
    aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }
  qsort(local_f8,8,0x18,compare_ref_frame_info);
  uVar11 = 0;
  piVar8 = local_e0;
  iVar3 = 0;
  do {
    if (piVar8[-2] == -1) {
      iVar3 = iVar3 + 1;
    }
    else if ((int)uVar7 <= piVar8[-2]) {
      local_130[6] = local_50;
      uStack_114 = CONCAT44(1,(undefined4)uStack_114);
      uVar5 = 6;
      if (uVar11 != 0xfffffffffffffff9) {
        local_130[4] = piVar8[-6];
        uStack_118 = 1;
        uVar5 = 5;
        if (-uVar11 < 5 || uVar11 == 0xfffffffffffffffb) {
          local_130[5] = *piVar8;
          uStack_114 = 0x100000001;
          uVar5 = ~uVar11 & 0xffffffff;
        }
      }
      goto LAB_003998bf;
    }
    piVar8 = piVar8 + 6;
    uVar11 = uVar11 - 1;
  } while (uVar11 != 0xfffffffffffffff8);
  uVar5 = 7;
LAB_003998bf:
  lVar6 = (long)iVar3;
  if ((int)uVar5 < iVar3) {
    uVar10 = 0;
  }
  else {
    piVar8 = local_f8 + lVar6 * 6;
    iVar9 = ((int)uVar5 - iVar3) + 1;
    local_11c = 0;
    uVar10 = 0;
    do {
      iVar12 = *piVar8;
      if (iVar12 == lst_map_idx) {
        *local_130 = (int)local_100;
        uVar10 = 1;
      }
      if (iVar12 == gld_map_idx) {
        local_130[3] = gld_map_idx;
        local_11c = 1;
      }
      piVar8 = piVar8 + 6;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  local_128 = CONCAT44(local_128._4_4_,uVar10);
  uVar11 = 0;
  do {
    lVar13 = (long)"\x02\x03\x05\x06\a"[uVar11];
    if (*(int *)((long)&local_130 + lVar13 * 4 + 4) != 1) {
      uVar4 = (uint)uVar5;
      if ((int)uVar4 < iVar3) {
LAB_003999ad:
        if (4 < uVar11) {
          return;
        }
        do {
          lVar13 = (long)"\x02\x03\x05\x06\a"[uVar11];
          if (*(int *)((long)&local_130 + lVar13 * 4 + 4) != 1) {
            local_130[lVar13 + -1] = local_f8[lVar6 * 6];
            *(undefined4 *)((long)&local_130 + lVar13 * 4 + 4) = 1;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 5);
        return;
      }
      lVar16 = (long)(int)uVar4;
      lVar15 = lVar16 << 0x20;
      lVar17 = lVar16 + 1;
      piVar8 = local_f8 + lVar16 * 6;
      while( true ) {
        uVar4 = uVar4 - 1;
        uVar5 = (ulong)uVar4;
        if (*piVar8 != lst_map_idx && *piVar8 != gld_map_idx) break;
        lVar15 = lVar15 + -0x100000000;
        lVar17 = lVar17 + -1;
        piVar8 = piVar8 + -6;
        if (lVar17 <= lVar6) goto LAB_003999ad;
      }
      local_130[lVar13 + -1] = local_f8[(lVar15 >> 0x20) * 6];
      *(undefined4 *)((long)&local_130 + lVar13 * 4 + 4) = 1;
    }
    uVar11 = uVar11 + 1;
    if (uVar11 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void av1_set_frame_refs(AV1_COMMON *const cm, int *remapped_ref_idx,
                        int lst_map_idx, int gld_map_idx) {
  int lst_frame_sort_idx = -1;
  int gld_frame_sort_idx = -1;

  assert(cm->seq_params->order_hint_info.enable_order_hint);
  assert(cm->seq_params->order_hint_info.order_hint_bits_minus_1 >= 0);
  const int cur_order_hint = (int)cm->current_frame.order_hint;
  const int cur_frame_sort_idx =
      1 << cm->seq_params->order_hint_info.order_hint_bits_minus_1;

  REF_FRAME_INFO ref_frame_info[REF_FRAMES];
  int ref_flag_list[INTER_REFS_PER_FRAME] = { 0, 0, 0, 0, 0, 0, 0 };

  for (int i = 0; i < REF_FRAMES; ++i) {
    const int map_idx = i;

    ref_frame_info[i].map_idx = map_idx;
    ref_frame_info[i].sort_idx = -1;

    RefCntBuffer *const buf = cm->ref_frame_map[map_idx];
    ref_frame_info[i].buf = buf;

    if (buf == NULL) continue;
    // If this assertion fails, there is a reference leak.
    assert(buf->ref_count > 0);

    const int offset = (int)buf->order_hint;
    ref_frame_info[i].sort_idx =
        (offset == -1) ? -1
                       : cur_frame_sort_idx +
                             get_relative_dist(&cm->seq_params->order_hint_info,
                                               offset, cur_order_hint);
    assert(ref_frame_info[i].sort_idx >= -1);

    if (map_idx == lst_map_idx) lst_frame_sort_idx = ref_frame_info[i].sort_idx;
    if (map_idx == gld_map_idx) gld_frame_sort_idx = ref_frame_info[i].sort_idx;
  }

  // Confirm both LAST_FRAME and GOLDEN_FRAME are valid forward reference
  // frames.
  if (lst_frame_sort_idx == -1 || lst_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  if (gld_frame_sort_idx == -1 || gld_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }

  // Sort ref frames based on their frame_offset values.
  qsort(ref_frame_info, REF_FRAMES, sizeof(REF_FRAME_INFO),
        compare_ref_frame_info);

  // Identify forward and backward reference frames.
  // Forward  reference: offset < order_hint
  // Backward reference: offset >= order_hint
  int fwd_start_idx = 0, fwd_end_idx = REF_FRAMES - 1;

  for (int i = 0; i < REF_FRAMES; i++) {
    if (ref_frame_info[i].sort_idx == -1) {
      fwd_start_idx++;
      continue;
    }

    if (ref_frame_info[i].sort_idx >= cur_frame_sort_idx) {
      fwd_end_idx = i - 1;
      break;
    }
  }

  int bwd_start_idx = fwd_end_idx + 1;
  int bwd_end_idx = REF_FRAMES - 1;

  // === Backward Reference Frames ===

  // == ALTREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_end_idx]);
    ref_flag_list[ALTREF_FRAME - LAST_FRAME] = 1;
    bwd_end_idx--;
  }

  // == BWDREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, BWDREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[BWDREF_FRAME - LAST_FRAME] = 1;
    bwd_start_idx++;
  }

  // == ALTREF2_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF2_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[ALTREF2_FRAME - LAST_FRAME] = 1;
  }

  // === Forward Reference Frames ===

  for (int i = fwd_start_idx; i <= fwd_end_idx; ++i) {
    // == LAST_FRAME ==
    if (ref_frame_info[i].map_idx == lst_map_idx) {
      set_ref_frame_info(remapped_ref_idx, LAST_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[LAST_FRAME - LAST_FRAME] = 1;
    }

    // == GOLDEN_FRAME ==
    if (ref_frame_info[i].map_idx == gld_map_idx) {
      set_ref_frame_info(remapped_ref_idx, GOLDEN_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[GOLDEN_FRAME - LAST_FRAME] = 1;
    }
  }

  assert(ref_flag_list[LAST_FRAME - LAST_FRAME] == 1 &&
         ref_flag_list[GOLDEN_FRAME - LAST_FRAME] == 1);

  // == LAST2_FRAME ==
  // == LAST3_FRAME ==
  // == BWDREF_FRAME ==
  // == ALTREF2_FRAME ==
  // == ALTREF_FRAME ==

  // Set up the reference frames in the anti-chronological order.
  static const MV_REFERENCE_FRAME ref_frame_list[INTER_REFS_PER_FRAME - 2] = {
    LAST2_FRAME, LAST3_FRAME, BWDREF_FRAME, ALTREF2_FRAME, ALTREF_FRAME
  };

  int ref_idx;
  for (ref_idx = 0; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];

    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;

    while (fwd_start_idx <= fwd_end_idx &&
           (ref_frame_info[fwd_end_idx].map_idx == lst_map_idx ||
            ref_frame_info[fwd_end_idx].map_idx == gld_map_idx)) {
      fwd_end_idx--;
    }
    if (fwd_start_idx > fwd_end_idx) break;

    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_end_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;

    fwd_end_idx--;
  }

  // Assign all the remaining frame(s), if any, to the earliest reference
  // frame.
  for (; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];
    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;
    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_start_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;
  }

  for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
    assert(ref_flag_list[i] == 1);
  }
}